

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O3

any * __thiscall
Omega_h::InputYamlReader::at_reduce
          (any *__return_storage_ptr__,InputYamlReader *this,int prod,
          vector<Omega_h::any,_std::allocator<Omega_h::any>_> *rhs)

{
  size_type *psVar1;
  storage_union *psVar2;
  vtable_type *pvVar3;
  size_type *psVar4;
  pointer paVar5;
  ulong *puVar6;
  pointer puVar7;
  pointer pcVar8;
  undefined7 uVar9;
  undefined1 uVar10;
  bool bVar11;
  int iVar12;
  long *plVar13;
  InputMap *pIVar14;
  type_info *ptVar15;
  any *paVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *leading_empties_or_comments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  ostream *poVar18;
  ParserFail *this_00;
  undefined8 *puVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  any *paVar21;
  long *plVar22;
  ulong uVar23;
  undefined1 *puVar24;
  long lVar25;
  ulong uVar26;
  char *pcVar27;
  undefined8 uVar28;
  undefined1 *puVar29;
  string ignored_comment;
  stringstream ss;
  string local_1e0;
  undefined1 local_1c0 [24];
  undefined1 auStack_1a8 [8];
  _Rb_tree_node_base _Stack_1a0;
  size_t local_180;
  unsigned_long local_38;
  
  switch(prod) {
  case 0:
  case 1:
    uVar26 = (ulong)(prod == 1);
    paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar23 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar5 >> 3) * -0x5555555555555555;
    if (uVar26 <= uVar23 && uVar23 - uVar26 != 0) {
      if (paVar5[uVar26].vtable == (vtable_type *)0x0) {
        pcVar27 = "!rhs.at(offset).empty()";
        uVar28 = 0x178;
      }
      else {
        ptVar15 = (*(paVar5[uVar26].vtable)->type)();
        pcVar27 = *(char **)(ptVar15 + 8);
        if ((pcVar27 == "N7Omega_h8InputMapE") ||
           ((*pcVar27 != '*' && (iVar12 = strcmp(pcVar27,"N7Omega_h8InputMapE"), iVar12 == 0)))) {
          psVar2 = &paVar5[uVar26].storage;
          pIVar14 = any_cast<Omega_h::InputMap&>((any *)psVar2);
          (pIVar14->super_Input).used = true;
          pvVar3 = (vtable_type *)psVar2[1].dynamic;
          __return_storage_ptr__->vtable = pvVar3;
          if (pvVar3 == (vtable_type *)0x0) {
            return __return_storage_ptr__;
          }
          (*pvVar3->move)(psVar2,&__return_storage_ptr__->storage);
          psVar2[1].dynamic = (void *)0x0;
          return __return_storage_ptr__;
        }
        pcVar27 = "result_any.type() == typeid(InputMap)";
        uVar28 = 0x17a;
      }
LAB_002ed710:
      fail("assertion %s failed at %s +%d\n",pcVar27,
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_input.cpp"
           ,uVar28);
    }
    goto LAB_002ed764;
  case 2:
    paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish != paVar5) {
      pvVar3 = paVar5->vtable;
      if (pvVar3 == (vtable_type *)0x0) {
        ptVar15 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar15 = (*pvVar3->type)();
      }
      pcVar27 = *(char **)(ptVar15 + 8);
      if ((pcVar27 != "N7Omega_h9NameValueE") &&
         ((*pcVar27 == '*' || (iVar12 = strcmp(pcVar27,"N7Omega_h9NameValueE"), iVar12 != 0))))
      goto switchD_002ec35b_caseD_4;
LAB_002ed4c6:
      paVar16 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
          super__Vector_impl_data._M_finish != paVar16) {
        map_first_item(__return_storage_ptr__,this,paVar16);
        return __return_storage_ptr__;
      }
    }
    goto LAB_002ed4f9;
  case 3:
    paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar23 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar5 >> 3) * -0x5555555555555555;
    if (uVar23 < 2) goto LAB_002ed545;
    pvVar3 = paVar5[1].vtable;
    if (pvVar3 == (vtable_type *)0x0) {
      ptVar15 = (type_info *)&void::typeinfo;
    }
    else {
      ptVar15 = (*pvVar3->type)();
    }
    pcVar27 = *(char **)(ptVar15 + 8);
    if ((pcVar27 != "N7Omega_h9NameValueE") &&
       ((*pcVar27 == '*' || (iVar12 = strcmp(pcVar27,"N7Omega_h9NameValueE"), iVar12 != 0))))
    goto switchD_002ec35b_caseD_7;
    paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish != paVar5) {
      pvVar3 = paVar5->vtable;
      if (pvVar3 == (vtable_type *)0x0) {
        ptVar15 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar15 = (*pvVar3->type)();
      }
      pcVar27 = *(char **)(ptVar15 + 8);
      if ((pcVar27 != "N7Omega_h8InputMapE") &&
         ((*pcVar27 == '*' || (iVar12 = strcmp(pcVar27,"N7Omega_h8InputMapE"), iVar12 != 0))))
      goto LAB_002ed4c6;
      paVar16 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                super__Vector_impl_data._M_start;
      paVar21 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      lVar25 = (long)paVar21 - (long)paVar16;
      goto LAB_002ecd07;
    }
    goto LAB_002ed4f9;
  default:
switchD_002ec35b_caseD_4:
    __return_storage_ptr__->vtable = (vtable_type *)0x0;
    break;
  case 7:
  case 0x2b:
  case 0x2d:
  case 0x39:
  case 0x41:
  case 0x53:
  case 0x57:
  case 0x5a:
  case 0x5b:
  case 0x5d:
  case 0x60:
  case 100:
  case 0x71:
switchD_002ec35b_caseD_7:
    psVar2 = &((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
               super__Vector_impl_data._M_start)->storage;
    if (&((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
          super__Vector_impl_data._M_finish)->storage != psVar2) {
      pvVar3 = (vtable_type *)psVar2[1].dynamic;
      __return_storage_ptr__->vtable = pvVar3;
      if (pvVar3 == (vtable_type *)0x0) {
        return __return_storage_ptr__;
      }
      (*pvVar3->move)(psVar2,&__return_storage_ptr__->storage);
      psVar2[1].dynamic = (void *)0x0;
      return __return_storage_ptr__;
    }
    goto LAB_002ed4f9;
  case 8:
  case 0x1e:
    paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish != paVar5) {
      pvVar3 = paVar5->vtable;
      if (pvVar3 == (vtable_type *)0x0) {
        ptVar15 = (type_info *)&void::typeinfo;
      }
      else {
        ptVar15 = (*pvVar3->type)();
      }
      pcVar27 = *(char **)(ptVar15 + 8);
      if ((pcVar27 != "N7Omega_h9NameValueE") &&
         ((*pcVar27 == '*' || (iVar12 = strcmp(pcVar27,"N7Omega_h9NameValueE"), iVar12 != 0)))) {
        pcVar27 = "rhs.at(0).type() == typeid(NameValue)";
        uVar28 = 0x195;
        goto LAB_002ed710;
      }
      paVar16 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
          super__Vector_impl_data._M_finish != paVar16) {
        map_first_item(__return_storage_ptr__,this,paVar16);
        if (__return_storage_ptr__->vtable == (vtable_type *)0x0) {
          ptVar15 = (type_info *)&void::typeinfo;
        }
        else {
          ptVar15 = (*__return_storage_ptr__->vtable->type)();
        }
        pcVar27 = *(char **)(ptVar15 + 8);
        if (pcVar27 == "N7Omega_h8InputMapE") {
          return __return_storage_ptr__;
        }
        if ((*pcVar27 != '*') && (iVar12 = strcmp(pcVar27,"N7Omega_h8InputMapE"), iVar12 == 0)) {
          return __return_storage_ptr__;
        }
        fail("assertion %s failed at %s +%d\n","result_any.type() == typeid(InputMap)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_input.cpp"
             ,0x197);
      }
    }
    goto LAB_002ed4f9;
  case 9:
    paVar16 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    paVar21 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    lVar25 = (long)paVar21 - (long)paVar16;
LAB_002ecd07:
    uVar23 = (lVar25 >> 3) * -0x5555555555555555;
    if (paVar21 == paVar16) {
LAB_002ed537:
      uVar26 = 0;
      goto LAB_002ed764;
    }
    if (1 < uVar23) {
      paVar21 = paVar16 + 1;
LAB_002ecd1e:
      map_next_item(__return_storage_ptr__,this,paVar16,paVar21);
      return __return_storage_ptr__;
    }
    goto LAB_002ed545;
  case 10:
  case 0xc:
  case 0x10:
  case 0x11:
  case 0x20:
  case 0x21:
  case 0x22:
    paVar16 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    paVar21 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar23 = ((long)paVar21 - (long)paVar16 >> 3) * -0x5555555555555555;
    if (paVar21 == paVar16) goto LAB_002ed537;
    if (4 < uVar23) {
      paVar21 = paVar16 + 4;
LAB_002ec406:
      map_item(__return_storage_ptr__,this,paVar16,paVar21);
      return __return_storage_ptr__;
    }
    goto LAB_002ed556;
  case 0xb:
    paVar16 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    paVar21 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar23 = ((long)paVar21 - (long)paVar16 >> 3) * -0x5555555555555555;
    if (paVar21 == paVar16) goto LAB_002ed537;
    if (3 < uVar23) {
      paVar21 = paVar16 + 3;
      goto LAB_002ec406;
    }
    goto LAB_002ed567;
  case 0xd:
    _Stack_1a0._M_left = &_Stack_1a0;
    auStack_1a8 = (undefined1  [8])0x0;
    _Stack_1a0._0_8_ = (pointer)0x0;
    local_1c0._8_7_ = 0;
    local_1c0[0xf] = 0;
    local_1c0._16_8_ = 0;
    local_1c0._0_7_ = 0x4b9848;
    local_1c0[7] = 0;
    _Stack_1a0._M_parent = (_Base_ptr)0x0;
    local_180 = 0;
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<Omega_h::InputMap>()::table
    ;
    _Stack_1a0._M_right = _Stack_1a0._M_left;
    any::do_construct<Omega_h::InputMap,Omega_h::InputMap>
              (__return_storage_ptr__,(InputMap *)local_1c0);
    goto LAB_002ecde9;
  case 0xe:
  case 0xf:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x3c:
    paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar23 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar5 >> 3) * -0x5555555555555555;
    if (1 < uVar23) {
      pvVar3 = paVar5[1].vtable;
      __return_storage_ptr__->vtable = pvVar3;
      if (pvVar3 == (vtable_type *)0x0) {
        return __return_storage_ptr__;
      }
      (*pvVar3->move)(&paVar5[1].storage,&__return_storage_ptr__->storage);
      paVar5[1].vtable = (vtable_type *)0x0;
      return __return_storage_ptr__;
    }
    goto LAB_002ed545;
  case 0x12:
  case 0x25:
    paVar16 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish != paVar16) {
      seq_first_item(__return_storage_ptr__,this,paVar16);
      return __return_storage_ptr__;
    }
    goto LAB_002ed4f9;
  case 0x13:
    paVar16 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    paVar21 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar23 = ((long)paVar21 - (long)paVar16 >> 3) * -0x5555555555555555;
    if (paVar21 == paVar16) goto LAB_002ed537;
    if (1 < uVar23) {
      paVar21 = paVar16 + 1;
LAB_002ecfa9:
      seq_next_item(__return_storage_ptr__,this,paVar16,paVar21);
      return __return_storage_ptr__;
    }
    goto LAB_002ed545;
  case 0x14:
  case 0x16:
  case 0x18:
  case 0x1a:
  case 0x1b:
    paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar23 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar5 >> 3) * -0x5555555555555555;
    if (3 < uVar23) {
      pvVar3 = paVar5[3].vtable;
      __return_storage_ptr__->vtable = pvVar3;
      if (pvVar3 == (vtable_type *)0x0) {
        return __return_storage_ptr__;
      }
      (*pvVar3->move)(&paVar5[3].storage,&__return_storage_ptr__->storage);
      paVar5[3].vtable = (vtable_type *)0x0;
      return __return_storage_ptr__;
    }
    goto LAB_002ed567;
  case 0x15:
  case 0x1c:
  case 0x23:
  case 0x37:
    paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar23 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar5 >> 3) * -0x5555555555555555;
    if (2 < uVar23) {
      pvVar3 = paVar5[2].vtable;
      __return_storage_ptr__->vtable = pvVar3;
      if (pvVar3 == (vtable_type *)0x0) {
        return __return_storage_ptr__;
      }
      (*pvVar3->move)(&paVar5[2].storage,&__return_storage_ptr__->storage);
      paVar5[2].vtable = (vtable_type *)0x0;
      return __return_storage_ptr__;
    }
LAB_002ed66c:
    uVar26 = 2;
    goto LAB_002ed764;
  case 0x17:
  case 0x19:
    paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar23 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar5 >> 3) * -0x5555555555555555;
    if (4 < uVar23) {
      pvVar3 = paVar5[4].vtable;
      __return_storage_ptr__->vtable = pvVar3;
      if (pvVar3 == (vtable_type *)0x0) {
        return __return_storage_ptr__;
      }
      (*pvVar3->move)(&paVar5[4].storage,&__return_storage_ptr__->storage);
      paVar5[4].vtable = (vtable_type *)0x0;
      return __return_storage_ptr__;
    }
LAB_002ed556:
    uVar26 = 4;
    goto LAB_002ed764;
  case 0x1d:
    _Stack_1a0._M_left = &_Stack_1a0;
    auStack_1a8 = (undefined1  [8])0x0;
    _Stack_1a0._0_8_ = (pointer)0x0;
    local_1c0._8_7_ = 0;
    local_1c0[0xf] = 0;
    local_1c0._16_8_ = 0;
    local_1c0._0_7_ = 0x4b9848;
    local_1c0[7] = 0;
    _Stack_1a0._M_parent = (_Base_ptr)0x0;
    local_180 = 0;
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<Omega_h::InputMap>()::table
    ;
    _Stack_1a0._M_right = _Stack_1a0._M_left;
    any::do_construct<Omega_h::InputMap,Omega_h::InputMap>
              (__return_storage_ptr__,(InputMap *)local_1c0);
LAB_002ecde9:
    local_1c0._0_7_ = 0x4b9848;
    local_1c0[7] = 0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Omega_h::Input>_>_>_>
                 *)auStack_1a8);
    break;
  case 0x1f:
    paVar16 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    paVar21 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar23 = ((long)paVar21 - (long)paVar16 >> 3) * -0x5555555555555555;
    if (paVar21 == paVar16) goto LAB_002ed537;
    if (3 < uVar23) {
      paVar21 = paVar16 + 3;
      goto LAB_002ecd1e;
    }
    goto LAB_002ed567;
  case 0x24:
    local_1c0._8_7_ = 0;
    local_1c0[0xf] = 0;
    local_1c0._16_8_ = 0;
    local_1c0._0_7_ = 0x4b9870;
    local_1c0[7] = 0;
    auStack_1a8 = (undefined1  [8])0x0;
    _Stack_1a0._0_8_ = (pointer)0x0;
    _Stack_1a0._M_parent = (_Base_ptr)0x0;
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<Omega_h::InputList>()::table;
    any::do_construct<Omega_h::InputList,Omega_h::InputList>
              (__return_storage_ptr__,(InputList *)local_1c0);
    local_1c0._0_7_ = 0x4b9870;
    local_1c0[7] = 0;
    std::vector<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
    ::~vector((vector<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
               *)auStack_1a8);
    break;
  case 0x26:
    paVar16 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    paVar21 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar23 = ((long)paVar21 - (long)paVar16 >> 3) * -0x5555555555555555;
    if (paVar21 == paVar16) goto LAB_002ed537;
    if (3 < uVar23) {
      paVar21 = paVar16 + 3;
      goto LAB_002ecfa9;
    }
LAB_002ed567:
    uVar26 = 3;
    goto LAB_002ed764;
  case 0x2a:
  case 0x2c:
    puVar24 = local_1c0 + 0x10;
    local_1c0._0_7_ = SUB87(puVar24,0);
    local_1c0[7] = (undefined1)((ulong)puVar24 >> 0x38);
    local_1c0._8_7_ = 0;
    local_1c0[0xf] = 0;
    local_1c0._16_8_ = local_1c0._16_8_ & 0xffffffffffffff00;
    paVar16 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar16) {
      uVar28 = 0;
      uVar23 = 0;
LAB_002ed7a9:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar28,
                 uVar23);
    }
    if (paVar16->vtable == (vtable_type *)0x0) {
      fail("assertion %s failed at %s +%d\n","!rhs.at(0).empty()",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_input.cpp"
           ,0x1fb);
    }
    pbVar17 = any_cast<std::__cxx11::string&&>(paVar16);
    std::__cxx11::string::operator=((string *)local_1c0,(string *)pbVar17);
    paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar23 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar5 >> 3) * -0x5555555555555555;
    if (uVar23 < 2) {
      uVar28 = 1;
      goto LAB_002ed7a9;
    }
    pbVar17 = any_cast<std::__cxx11::string&>(paVar5 + 1);
    std::__cxx11::string::_M_append(local_1c0,(ulong)(pbVar17->_M_dataplus)._M_p);
    if (prod == 0x2c) {
      paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar23 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)paVar5 >> 3) * -0x5555555555555555;
      if (uVar23 < 3) {
        uVar28 = 2;
        goto LAB_002ed7a9;
      }
      pbVar17 = any_cast<std::__cxx11::string&>(paVar5 + 2);
      std::__cxx11::string::_M_append(local_1c0,(ulong)(pbVar17->_M_dataplus)._M_p);
    }
    remove_trailing_whitespace((string *)local_1c0);
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
    puVar19 = (undefined8 *)operator_new(0x20);
    *puVar19 = puVar19 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p == &local_1e0.field_2) {
      puVar19[2] = CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                            local_1e0.field_2._M_local_buf[0]);
      puVar19[3] = local_1e0.field_2._8_8_;
    }
    else {
      *puVar19 = local_1e0._M_dataplus._M_p;
      puVar19[2] = CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                            local_1e0.field_2._M_local_buf[0]);
    }
    puVar19[1] = local_1e0._M_string_length;
    (__return_storage_ptr__->storage).dynamic = puVar19;
    puVar29 = (undefined1 *)CONCAT17(local_1c0[7],local_1c0._0_7_);
    if (puVar29 == puVar24) {
      return __return_storage_ptr__;
    }
LAB_002ed48e:
    operator_delete(puVar29,local_1c0._16_8_ + 1);
    break;
  case 0x2e:
  case 0x2f:
    paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar23 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar5 >> 3) * -0x5555555555555555;
    if (1 < uVar23) {
      pbVar17 = any_cast<std::__cxx11::string&&>(paVar5 + 1);
      local_1c0._0_7_ = SUB87(local_1c0 + 0x10,0);
      local_1c0[7] = (undefined1)((ulong)(local_1c0 + 0x10) >> 0x38);
      pcVar8 = (pbVar17->_M_dataplus)._M_p;
      paVar20 = &pbVar17->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar8 == paVar20) {
        local_1c0._16_8_ = paVar20->_M_allocated_capacity;
        auStack_1a8 = *(undefined1 (*) [8])((long)&pbVar17->field_2 + 8);
      }
      else {
        local_1c0._0_7_ = SUB87(pcVar8,0);
        local_1c0[7] = (undefined1)((ulong)pcVar8 >> 0x38);
        local_1c0._16_8_ = paVar20->_M_allocated_capacity;
      }
      local_1c0._8_7_ = (undefined7)pbVar17->_M_string_length;
      local_1c0[0xf] = (undefined1)(pbVar17->_M_string_length >> 0x38);
      (pbVar17->_M_dataplus)._M_p = (pointer)paVar20;
      pbVar17->_M_string_length = 0;
      (pbVar17->field_2)._M_local_buf[0] = '\0';
      paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 3) *
                 -0x5555555555555555) < 3) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
      }
      pbVar17 = any_cast<std::__cxx11::string&>(paVar5 + 2);
      std::__cxx11::string::_M_append(local_1c0,(ulong)(pbVar17->_M_dataplus)._M_p);
      __return_storage_ptr__->vtable =
           (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
      plVar13 = (long *)operator_new(0x20);
      goto LAB_002ed3fd;
    }
LAB_002ed545:
    uVar26 = 1;
    goto LAB_002ed764;
  case 0x30:
    uVar26 = 0;
    goto LAB_002ed055;
  case 0x31:
  case 0x32:
    uVar26 = 1;
    goto LAB_002ed055;
  case 0x33:
    uVar26 = 2;
LAB_002ed055:
    paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar23 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)paVar5 >> 3) * -0x5555555555555555;
    if (uVar23 < uVar26 || uVar23 - uVar26 == 0) goto LAB_002ed764;
    bVar11 = any::is_typed(paVar5 + uVar26,(type_info *)&char::typeinfo);
    if (!bVar11) {
LAB_002ed509:
      puVar19 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar19 = &PTR__bad_cast_004b86a8;
      __cxa_throw(puVar19,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    puVar29 = local_1c0 + 0x10;
    local_1c0._0_7_ = SUB87(puVar29,0);
    local_1c0[7] = (undefined1)((ulong)puVar29 >> 0x38);
    local_1c0._8_7_ = 0;
    local_1c0[0xf] = 0;
    local_1c0._16_8_ = local_1c0._16_8_ & 0xffffffffffffff00;
    if (prod == 0x33) {
      std::__cxx11::string::append(local_1c0);
    }
    else if ((prod == 0x32) || (prod == 0x31)) {
      std::__cxx11::string::push_back((char)local_1c0);
    }
    std::__cxx11::string::push_back((char)local_1c0);
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
    plVar13 = (long *)operator_new(0x20);
    plVar22 = plVar13 + 2;
    *plVar13 = (long)plVar22;
    puVar24 = (undefined1 *)CONCAT17(local_1c0[7],local_1c0._0_7_);
    if (puVar24 == puVar29) {
      goto LAB_002ed423;
    }
    goto LAB_002ed411;
  case 0x34:
  case 0x3f:
  case 0x43:
  case 0x45:
  case 0x47:
  case 0x49:
  case 0x4c:
  case 0x4f:
  case 0x72:
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
    plVar13 = (long *)operator_new(0x20);
    *plVar13 = (long)(plVar13 + 2);
    *(undefined1 *)(plVar13 + 2) = 0;
    *(ulong *)((long)plVar13 + 0x11) = CONCAT17(local_1c0[7],local_1c0._0_7_);
    plVar13[3] = CONCAT71(local_1c0._8_7_,local_1c0[7]);
    plVar13[1] = 0;
    goto LAB_002ed42f;
  case 0x35:
    paVar16 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish != paVar16) {
      pbVar17 = any_cast<std::__cxx11::string&&>(paVar16);
      local_1c0._0_7_ = SUB87(local_1c0 + 0x10,0);
      local_1c0[7] = (undefined1)((ulong)(local_1c0 + 0x10) >> 0x38);
      pcVar8 = (pbVar17->_M_dataplus)._M_p;
      paVar20 = &pbVar17->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar8 == paVar20) {
        local_1c0._16_8_ = paVar20->_M_allocated_capacity;
        auStack_1a8 = *(undefined1 (*) [8])((long)&pbVar17->field_2 + 8);
      }
      else {
        local_1c0._0_7_ = SUB87(pcVar8,0);
        local_1c0[7] = (undefined1)((ulong)pcVar8 >> 0x38);
        local_1c0._16_8_ = paVar20->_M_allocated_capacity;
      }
      local_1c0._8_7_ = (undefined7)pbVar17->_M_string_length;
      local_1c0[0xf] = (undefined1)(pbVar17->_M_string_length >> 0x38);
      (pbVar17->_M_dataplus)._M_p = (pointer)paVar20;
      pbVar17->_M_string_length = 0;
      (pbVar17->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::string::push_back((char)local_1c0);
      paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 3) *
                 -0x5555555555555555) < 3) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
      }
      pbVar17 = any_cast<std::__cxx11::string&>(paVar5 + 2);
      std::__cxx11::string::_M_append(local_1c0,(ulong)(pbVar17->_M_dataplus)._M_p);
      __return_storage_ptr__->vtable =
           (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
      plVar13 = (long *)operator_new(0x20);
      goto LAB_002ed3fd;
    }
    goto LAB_002ed4f9;
  case 0x38:
    puVar7 = (this->super_Reader).symbol_indentation_stack.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar23 = (long)(this->super_Reader).symbol_indentation_stack.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)puVar7 >> 3;
    if (uVar23 < 5) {
      uVar26 = uVar23 - 5;
      goto LAB_002ed764;
    }
    paVar16 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish != paVar16) {
      local_38 = puVar7[uVar23 - 5];
      pbVar17 = any_cast<std::__cxx11::string&>(paVar16);
      paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar23 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)paVar5 >> 3) * -0x5555555555555555;
      if (uVar23 < 3) goto LAB_002ed66c;
      leading_empties_or_comments = any_cast<std::__cxx11::string&>(paVar5 + 2);
      paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar23 = ((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)paVar5 >> 3) * -0x5555555555555555;
      if (4 < uVar23) {
        rest = any_cast<std::__cxx11::string&>(paVar5 + 4);
        puVar24 = local_1c0 + 0x10;
        local_1c0._0_7_ = SUB87(puVar24,0);
        uVar9 = local_1c0._0_7_;
        local_1c0[7] = (undefined1)((ulong)puVar24 >> 0x38);
        uVar10 = local_1c0[7];
        local_1c0._8_7_ = 0;
        local_1c0[0xf] = 0;
        local_1c0._16_8_ = local_1c0._16_8_ & 0xffffffffffffff00;
        local_1e0._M_string_length = 0;
        local_1e0.field_2._M_local_buf[0] = '\0';
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
        handle_block_scalar(this,local_38,pbVar17,leading_empties_or_comments,rest,
                            (string *)local_1c0,&local_1e0);
        __return_storage_ptr__->vtable =
             (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
        plVar13 = (long *)operator_new(0x20);
        *plVar13 = (long)(plVar13 + 2);
        if ((undefined1 *)CONCAT17(local_1c0[7],local_1c0._0_7_) == puVar24) {
          plVar13[2] = local_1c0._16_8_;
          plVar13[3] = (long)auStack_1a8;
        }
        else {
          *plVar13 = (long)CONCAT17(local_1c0[7],local_1c0._0_7_);
          plVar13[2] = local_1c0._16_8_;
        }
        plVar13[1] = CONCAT17(local_1c0[0xf],local_1c0._8_7_);
        local_1c0._8_7_ = 0;
        local_1c0[0xf] = 0;
        local_1c0._16_8_ = local_1c0._16_8_ & 0xffffffffffffff00;
        (__return_storage_ptr__->storage).dynamic = plVar13;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p == &local_1e0.field_2) {
          return __return_storage_ptr__;
        }
        local_1c0._0_7_ = uVar9;
        local_1c0[7] = uVar10;
        operator_delete(local_1e0._M_dataplus._M_p,
                        CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                                 local_1e0.field_2._M_local_buf[0]) + 1);
        puVar29 = (undefined1 *)CONCAT17(local_1c0[7],local_1c0._0_7_);
        if (puVar29 == puVar24) {
          return __return_storage_ptr__;
        }
        goto LAB_002ed48e;
      }
      goto LAB_002ed556;
    }
    goto LAB_002ed4f9;
  case 0x3a:
  case 0x3b:
  case 0x4a:
  case 0x4d:
    paVar16 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish != paVar16) {
      bVar11 = any::is_typed(paVar16,(type_info *)&std::__cxx11::string::typeinfo);
      if ((!bVar11) ||
         (puVar19 = (undefined8 *)(paVar16->storage).dynamic, puVar19 == (undefined8 *)0x0))
      goto LAB_002ed509;
      local_1c0._0_7_ = SUB87(local_1c0 + 0x10,0);
      local_1c0[7] = (undefined1)((ulong)(local_1c0 + 0x10) >> 0x38);
      psVar4 = (size_type *)*puVar19;
      psVar1 = puVar19 + 2;
      if (psVar4 == psVar1) {
        local_1c0._16_8_ = *psVar1;
        auStack_1a8 = (undefined1  [8])puVar19[3];
      }
      else {
        local_1c0._0_7_ = SUB87(psVar4,0);
        local_1c0[7] = (undefined1)((ulong)psVar4 >> 0x38);
        local_1c0._16_8_ = *psVar1;
      }
      local_1c0._8_7_ = (undefined7)puVar19[1];
      local_1c0[0xf] = (undefined1)((ulong)puVar19[1] >> 0x38);
      *puVar19 = psVar1;
      puVar19[1] = 0;
      *(undefined1 *)(puVar19 + 2) = 0;
      paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 3) *
                 -0x5555555555555555) < 2) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
      }
      paVar16 = paVar5 + 1;
      bVar11 = any::is_typed(paVar16,(type_info *)&std::__cxx11::string::typeinfo);
      if ((!bVar11) || (puVar6 = (ulong *)(paVar16->storage).dynamic, puVar6 == (ulong *)0x0)) {
        puVar19 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar19 = &PTR__bad_cast_004b86a8;
        __cxa_throw(puVar19,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      std::__cxx11::string::_M_append(local_1c0,*puVar6);
      __return_storage_ptr__->vtable =
           (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
      plVar13 = (long *)operator_new(0x20);
      goto LAB_002ecc18;
    }
    goto LAB_002ed4f9;
  case 0x3d:
  case 0x3e:
    local_1c0._0_7_ = SUB87(local_1c0 + 0x10,0);
    local_1c0[7] = (undefined1)((ulong)(local_1c0 + 0x10) >> 0x38);
    local_1c0._8_7_ = 0;
    local_1c0[0xf] = 0;
    local_1c0._16_8_ = (ulong)(uint7)local_1c0._17_7_ << 8;
    std::__cxx11::string::append(local_1c0);
    paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 3) *
               -0x5555555555555555) < 2) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
    }
    pbVar17 = any_cast<std::__cxx11::string&>(paVar5 + 1);
    std::__cxx11::string::_M_append(local_1c0,(ulong)(pbVar17->_M_dataplus)._M_p);
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
    plVar13 = (long *)operator_new(0x20);
    goto LAB_002ed3fd;
  case 0x40:
  case 0x44:
  case 0x46:
  case 0x48:
  case 0x50:
  case 0x73:
  case 0x75:
    paVar16 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish != paVar16) {
      if (paVar16->vtable == (vtable_type *)0x0) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1c0 + 0x10),"leading characters in ",0x16);
        poVar18 = (ostream *)std::ostream::operator<<((ostream *)(local_1c0 + 0x10),prod);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,": any was empty\n",0x10);
        this_00 = (ParserFail *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        ParserFail::ParserFail(this_00,&local_1e0);
        __cxa_throw(this_00,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
      }
      bVar11 = any::is_typed(paVar16,(type_info *)&std::__cxx11::string::typeinfo);
      if ((!bVar11) ||
         (puVar19 = (undefined8 *)(paVar16->storage).dynamic, puVar19 == (undefined8 *)0x0))
      goto LAB_002ed509;
      local_1c0._0_7_ = SUB87(local_1c0 + 0x10,0);
      local_1c0[7] = (undefined1)((ulong)(local_1c0 + 0x10) >> 0x38);
      psVar4 = (size_type *)*puVar19;
      psVar1 = puVar19 + 2;
      if (psVar4 == psVar1) {
        local_1c0._16_8_ = *psVar1;
        auStack_1a8 = (undefined1  [8])puVar19[3];
      }
      else {
        local_1c0._0_7_ = SUB87(psVar4,0);
        local_1c0[7] = (undefined1)((ulong)psVar4 >> 0x38);
        local_1c0._16_8_ = *psVar1;
      }
      local_1c0._8_7_ = (undefined7)puVar19[1];
      local_1c0[0xf] = (undefined1)((ulong)puVar19[1] >> 0x38);
      *puVar19 = psVar1;
      puVar19[1] = 0;
      *(undefined1 *)(puVar19 + 2) = 0;
      paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 3) *
                 -0x5555555555555555) < 2) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
      }
      bVar11 = any::is_typed(paVar5 + 1,(type_info *)&char::typeinfo);
      if (!bVar11) {
        puVar19 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar19 = &PTR__bad_cast_004b86a8;
        __cxa_throw(puVar19,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      std::__cxx11::string::push_back((char)local_1c0);
      __return_storage_ptr__->vtable =
           (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
      plVar13 = (long *)operator_new(0x20);
      goto LAB_002ecc18;
    }
LAB_002ed4f9:
    uVar26 = 0;
    uVar23 = 0;
LAB_002ed764:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar26,
               uVar23);
  case 0x42:
  case 0x55:
  case 0x67:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x2d;
    break;
  case 0x4b:
    local_1c0._0_7_ = SUB87(local_1c0 + 0x10,0);
    local_1c0[7] = (undefined1)((ulong)(local_1c0 + 0x10) >> 0x38);
    local_1c0._8_7_ = 0;
    local_1c0[0xf] = 0;
    local_1c0._16_8_ = (ulong)(uint7)local_1c0._17_7_ << 8;
    paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 3) *
               -0x5555555555555555) < 3) {
      uVar28 = 2;
LAB_002ed783:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar28)
      ;
    }
    pbVar17 = any_cast<std::__cxx11::string&>(paVar5 + 2);
    paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 3) *
               -0x5555555555555555) < 2) {
      uVar28 = 1;
      goto LAB_002ed783;
    }
    any_cast<char>(paVar5 + 1);
    std::__cxx11::string::push_back((char)local_1c0);
    std::__cxx11::string::_M_append(local_1c0,(ulong)(pbVar17->_M_dataplus)._M_p);
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
    plVar13 = (long *)operator_new(0x20);
LAB_002ecc18:
    plVar22 = plVar13 + 2;
    *plVar13 = (long)plVar22;
    puVar24 = (undefined1 *)CONCAT17(local_1c0[7],local_1c0._0_7_);
    if (puVar24 == local_1c0 + 0x10) {
      goto LAB_002ed423;
    }
    goto LAB_002ed411;
  case 0x4e:
    local_1c0._0_7_ = SUB87(local_1c0 + 0x10,0);
    local_1c0[7] = (undefined1)((ulong)(local_1c0 + 0x10) >> 0x38);
    local_1c0._8_7_ = 0;
    local_1c0[0xf] = 0;
    local_1c0._16_8_ = (ulong)(uint7)local_1c0._17_7_ << 8;
    paVar5 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)paVar5 >> 3) *
               -0x5555555555555555) < 3) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
    }
    pbVar17 = any_cast<std::__cxx11::string&>(paVar5 + 2);
    std::__cxx11::string::push_back((char)local_1c0);
    std::__cxx11::string::_M_append(local_1c0,(ulong)(pbVar17->_M_dataplus)._M_p);
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
    plVar13 = (long *)operator_new(0x20);
    goto LAB_002ed3fd;
  case 0x51:
  case 0x74:
    local_1c0._0_7_ = SUB87(local_1c0 + 0x10,0);
    local_1c0[7] = (undefined1)((ulong)(local_1c0 + 0x10) >> 0x38);
    local_1c0._8_7_ = 0;
    local_1c0[0xf] = 0;
    local_1c0._16_8_ = (ulong)(uint7)local_1c0._17_7_ << 8;
    paVar16 = (rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if ((rhs->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
        super__Vector_impl_data._M_finish == paVar16) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    any_cast<char>(paVar16);
    std::__cxx11::string::push_back((char)local_1c0);
    __return_storage_ptr__->vtable =
         (vtable_type *)any::vtable_for_type<std::__cxx11::string>()::table;
    plVar13 = (long *)operator_new(0x20);
LAB_002ed3fd:
    plVar22 = plVar13 + 2;
    *plVar13 = (long)plVar22;
    puVar24 = (undefined1 *)CONCAT17(local_1c0[7],local_1c0._0_7_);
    if (puVar24 == local_1c0 + 0x10) {
LAB_002ed423:
      *(undefined4 *)plVar22 = local_1c0._16_4_;
      *(undefined4 *)((long)plVar22 + 4) = local_1c0._20_4_;
      *(undefined4 *)(plVar22 + 1) = auStack_1a8._0_4_;
      *(undefined4 *)((long)plVar22 + 0xc) = auStack_1a8._4_4_;
    }
    else {
LAB_002ed411:
      *plVar13 = (long)puVar24;
      plVar13[2] = local_1c0._16_8_;
    }
    plVar13[1] = CONCAT17(local_1c0[0xf],local_1c0._8_7_);
LAB_002ed42f:
    (__return_storage_ptr__->storage).dynamic = plVar13;
    break;
  case 0x54:
  case 0x66:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x2e;
    break;
  case 0x56:
  case 0x5c:
  case 0x62:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x27;
    break;
  case 0x58:
  case 0x5e:
  case 0x61:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x22;
    break;
  case 0x59:
  case 0x5f:
  case 99:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x5c;
    break;
  case 0x65:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x3a;
    break;
  case 0x68:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x7c;
    break;
  case 0x69:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x5b;
    break;
  case 0x6a:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x5d;
    break;
  case 0x6b:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x7b;
    break;
  case 0x6c:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x7d;
    break;
  case 0x6d:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x3e;
    break;
  case 0x6e:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x2c;
    break;
  case 0x6f:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x25;
    break;
  case 0x70:
    __return_storage_ptr__->vtable = (vtable_type *)any::vtable_for_type<char>()::table;
    *(undefined1 *)&__return_storage_ptr__->storage = 0x21;
  }
  return __return_storage_ptr__;
}

Assistant:

any at_reduce(int prod, std::vector<any>& rhs) override final {
    switch (prod) {
      case yaml::PROD_DOC:
      case yaml::PROD_DOC2: {
        std::size_t offset = prod == yaml::PROD_DOC2 ? 1 : 0;
        OMEGA_H_CHECK(!rhs.at(offset).empty());
        auto& result_any = rhs.at(offset);
        OMEGA_H_CHECK(result_any.type() == typeid(InputMap));
        auto& map = any_cast<InputMap&>(result_any);
        map.used = true;
        return any(std::move(result_any));
      }
      case yaml::PROD_TOP_BMAP: {
        return any(std::move(rhs.at(0)));
      }
      case yaml::PROD_TOP_FIRST: {
        if (rhs.at(0).type() == typeid(NameValue)) {
          return map_first_item(rhs.at(0));
        }
        return any();
      }
      case yaml::PROD_TOP_NEXT: {
        if (rhs.at(1).type() == typeid(NameValue)) {
          if (rhs.at(0).type() == typeid(InputMap)) {
            return map_next_item(rhs.at(0), rhs.at(1));
          } else {
            return map_first_item(rhs.at(0));
          }
        } else {
          return any(std::move(rhs.at(0)));
        }
      }
      case yaml::PROD_BMAP_FIRST:
      case yaml::PROD_FMAP_FIRST: {
        OMEGA_H_CHECK(rhs.at(0).type() == typeid(NameValue));
        auto result_any = map_first_item(rhs.at(0));
        OMEGA_H_CHECK(result_any.type() == typeid(InputMap));
        return result_any;
      }
      case yaml::PROD_BMAP_NEXT: {
        return map_next_item(rhs.at(0), rhs.at(1));
      }
      case yaml::PROD_FMAP_NEXT: {
        return map_next_item(rhs.at(0), rhs.at(3));
      }
      case yaml::PROD_BMAP_SCALAR:
      case yaml::PROD_FMAP_SCALAR: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_FMAP_FMAP: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_FMAP_FSEQ: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_BMAP_BSCALAR: {
        return map_item(rhs.at(0), rhs.at(3));
      }
      case yaml::PROD_BMAP_BVALUE: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_BVALUE_EMPTY: {
        return InputMap();
      }
      case yaml::PROD_BVALUE_BMAP: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_BVALUE_BSEQ: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_BMAP_FMAP: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_BMAP_FSEQ: {
        return map_item(rhs.at(0), rhs.at(4));
      }
      case yaml::PROD_BSEQ_FIRST: {
        return seq_first_item(rhs.at(0));
      }
      case yaml::PROD_BSEQ_NEXT: {
        return seq_next_item(rhs.at(0), rhs.at(1));
      }
      case yaml::PROD_BSEQ_SCALAR: {
        return any(std::move(rhs.at(3)));
      }
      case yaml::PROD_BSEQ_BSCALAR: {
        return any(std::move(rhs.at(2)));
      }
      case yaml::PROD_BSEQ_BMAP:
      case yaml::PROD_BSEQ_FMAP: {
        return any(std::move(rhs.at(3)));
      }
      case yaml::PROD_BSEQ_BMAP_TRAIL: {
        return any(std::move(rhs.at(4)));
      }
      case yaml::PROD_BSEQ_BSEQ:
      case yaml::PROD_BSEQ_FSEQ: {
        return any(std::move(rhs.at(3)));
      }
      case yaml::PROD_BSEQ_BSEQ_TRAIL: {
        return any(std::move(rhs.at(4)));
      }
      case yaml::PROD_FMAP: {
        return any(std::move(rhs.at(2)));
      }
      case yaml::PROD_FMAP_EMPTY: {
        return InputMap();
      }
      case yaml::PROD_FSEQ: {
        return any(std::move(rhs.at(2)));
      }
      case yaml::PROD_FSEQ_EMPTY: {
        return InputList();
      }
      case yaml::PROD_FSEQ_FIRST: {
        return seq_first_item(rhs.at(0));
      }
      case yaml::PROD_FSEQ_NEXT: {
        return seq_next_item(rhs.at(0), rhs.at(3));
      }
      case yaml::PROD_FSEQ_SCALAR: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_FSEQ_FSEQ: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_FSEQ_FMAP: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_SCALAR_QUOTED:
      case yaml::PROD_MAP_SCALAR_QUOTED: {
        return any(std::move(rhs.at(0)));
      }
      case yaml::PROD_SCALAR_RAW:
      case yaml::PROD_MAP_SCALAR_RAW: {
        std::string text;
        OMEGA_H_CHECK(!rhs.at(0).empty());
        text = any_cast<std::string&&>(std::move(rhs.at(0)));
        text += any_cast<std::string&>(rhs.at(1));
        if (prod == yaml::PROD_MAP_SCALAR_RAW) {
          text += any_cast<std::string&>(rhs.at(2));
        }
        return remove_trailing_whitespace(text);
      }
      case yaml::PROD_SCALAR_HEAD_OTHER:
      case yaml::PROD_SCALAR_HEAD_DOT:
      case yaml::PROD_SCALAR_HEAD_DASH:
      case yaml::PROD_SCALAR_HEAD_DOT_DOT: {
        std::size_t offset;
        if (prod == yaml::PROD_SCALAR_HEAD_OTHER)
          offset = 0;
        else if (prod == yaml::PROD_SCALAR_HEAD_DOT_DOT)
          offset = 2;
        else
          offset = 1;
        char second = any_cast<char>(rhs.at(offset));
        std::string result;
        if (prod == yaml::PROD_SCALAR_HEAD_DOT)
          result += '.';
        else if (prod == yaml::PROD_SCALAR_HEAD_DASH)
          result += '-';
        else if (prod == yaml::PROD_SCALAR_HEAD_DOT_DOT)
          result += "..";
        result += second;
        return any(std::move(result));
      }
      case yaml::PROD_SCALAR_DQUOTED:
      case yaml::PROD_SCALAR_SQUOTED: {
        auto text = any_cast<std::string&&>(std::move(rhs.at(1)));
        text += any_cast<std::string&>(rhs.at(2));
        return any(std::move(text));
      }
      case yaml::PROD_MAP_SCALAR_ESCAPED_EMPTY: {
        return std::string();
      }
      case yaml::PROD_MAP_SCALAR_ESCAPED_NEXT: {
        auto str = any_cast<std::string&&>(std::move(rhs.at(0)));
        str += ',';
        str += any_cast<std::string&>(rhs.at(2));
        return any(std::move(str));
      }
      case yaml::PROD_TAG: {
        return any(std::move(rhs.at(2)));
      }
      case yaml::PROD_BSCALAR: {
        auto parent_indent_level = this->symbol_indentation_stack.at(
            this->symbol_indentation_stack.size() - 5);
        auto& header = any_cast<std::string&>(rhs.at(0));
        auto& leading_empties_or_comments = any_cast<std::string&>(rhs.at(2));
        auto& rest = any_cast<std::string&>(rhs.at(4));
        std::string content;
        std::string ignored_comment;
        handle_block_scalar(parent_indent_level, header,
            leading_empties_or_comments, rest, content, ignored_comment);
        return any(std::move(content));
      }
      case yaml::PROD_BSCALAR_FIRST: {
        return any(std::move(rhs.at(0)));
      }
      // all these cases reduce to concatenating two strings
      case yaml::PROD_BSCALAR_NEXT:
      case yaml::PROD_BSCALAR_LINE:
      case yaml::PROD_DESCAPE_NEXT:
      case yaml::PROD_SESCAPE_NEXT: {
        auto str = any_cast<std::string&&>(std::move(rhs.at(0)));
        str += any_cast<std::string&>(rhs.at(1));
        return any(std::move(str));
      }
      case yaml::PROD_BSCALAR_INDENT: {
        return any(std::move(rhs.at(1)));
      }
      case yaml::PROD_BSCALAR_HEADER_LITERAL:
      case yaml::PROD_BSCALAR_HEADER_FOLDED: {
        std::string result;
        if (prod == yaml::PROD_BSCALAR_HEADER_LITERAL) {
          result += "|";
        } else {
          result += ">";
        }
        auto& rest = any_cast<std::string&>(rhs.at(1));
        result += rest;
        return any(std::move(result));
      }
      case yaml::PROD_DESCAPE: {
        std::string str;
        auto& rest = any_cast<std::string&>(rhs.at(2));
        str += any_cast<char>(rhs.at(1));
        str += rest;
        return any(std::move(str));
      }
      case yaml::PROD_SESCAPE: {
        std::string str;
        auto& rest = any_cast<std::string&>(rhs.at(2));
        str += '\'';
        str += rest;
        return any(std::move(str));
      }
      case yaml::PROD_OTHER_FIRST:
      case yaml::PROD_SPACE_PLUS_FIRST: {
        std::string str;
        str.push_back(any_cast<char>(rhs.at(0)));
        return any(std::move(str));
      }
      case yaml::PROD_SCALAR_TAIL_SPACE:
      case yaml::PROD_SCALAR_TAIL_OTHER:
      case yaml::PROD_DESCAPED_DQUOTED:
      case yaml::PROD_DQUOTED_COMMON:
      case yaml::PROD_SQUOTED_COMMON:
      case yaml::PROD_ANY_COMMON:
      case yaml::PROD_COMMON_SPACE:
      case yaml::PROD_COMMON_OTHER:
      case yaml::PROD_BSCALAR_HEAD_OTHER: {
        return any(std::move(rhs.at(0)));
      }
      // all these cases reduce to appending a character
      case yaml::PROD_DQUOTED_NEXT:
      case yaml::PROD_SQUOTED_NEXT:
      case yaml::PROD_ANY_NEXT:
      case yaml::PROD_SCALAR_TAIL_NEXT:
      case yaml::PROD_SPACE_STAR_NEXT:
      case yaml::PROD_SPACE_PLUS_NEXT:
      case yaml::PROD_BSCALAR_HEAD_NEXT: {
        if (rhs.at(0).empty()) {
          std::stringstream ss;
          ss << "leading characters in " << prod << ": any was empty\n";
          throw ParserFail(ss.str());
        }
        auto str = any_cast<std::string&&>(std::move(rhs.at(0)));
        str += any_cast<char>(rhs.at(1));
        return any(std::move(str));
      }
      case yaml::PROD_DQUOTED_EMPTY:
      case yaml::PROD_SQUOTED_EMPTY:
      case yaml::PROD_ANY_EMPTY:
      case yaml::PROD_DESCAPE_EMPTY:
      case yaml::PROD_SESCAPE_EMPTY:
      case yaml::PROD_SCALAR_TAIL_EMPTY:
      case yaml::PROD_SPACE_STAR_EMPTY:
      case yaml::PROD_BSCALAR_HEAD_EMPTY: {
        return std::string();
      }
      case yaml::PROD_DESCAPED_DQUOT:
      case yaml::PROD_SQUOTED_DQUOT:
      case yaml::PROD_ANY_DQUOT: {
        return '"';
      }
      case yaml::PROD_DESCAPED_SLASH:
      case yaml::PROD_SQUOTED_SLASH:
      case yaml::PROD_ANY_SLASH: {
        return '\\';
      }
      case yaml::PROD_SCALAR_TAIL_SQUOT:
      case yaml::PROD_DQUOTED_SQUOT:
      case yaml::PROD_ANY_SQUOT: {
        return '\'';
      }
      case yaml::PROD_COMMON_COLON: {
        return ':';
      }
      case yaml::PROD_SCALAR_TAIL_DOT:
      case yaml::PROD_COMMON_DOT: {
        return '.';
      }
      case yaml::PROD_SCALAR_TAIL_DASH:
      case yaml::PROD_COMMON_DASH:
      case yaml::PROD_BSCALAR_HEAD_DASH: {
        return '-';
      }
      case yaml::PROD_COMMON_PIPE: {
        return '|';
      }
      case yaml::PROD_COMMON_LSQUARE: {
        return '[';
      }
      case yaml::PROD_COMMON_RSQUARE: {
        return ']';
      }
      case yaml::PROD_COMMON_LCURLY: {
        return '{';
      }
      case yaml::PROD_COMMON_RCURLY: {
        return '}';
      }
      case yaml::PROD_COMMON_RANGLE: {
        return '>';
      }
      case yaml::PROD_COMMON_COMMA: {
        return ',';
      }
      case yaml::PROD_COMMON_PERCENT: {
        return '%';
      }
      case yaml::PROD_COMMON_EXCL: {
        return '!';
      }
    }
    return any();
  }